

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O2

void __thiscall
Deque<int,_std::allocator<int>_>::Deque
          (Deque<int,_std::allocator<int>_> *this,Deque<int,_std::allocator<int>_> *other)

{
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::RingBuffer(&this->current_,(other->current_).allocSize_,&local_21);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::RingBuffer(&this->small_,(other->small_).allocSize_,&local_22);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::RingBuffer(&this->big_,(other->big_).allocSize_,&local_23);
  Deque<int,std::allocator<int>>::copy<std::allocator<int>>
            ((Deque<int,std::allocator<int>> *)this,other);
  return;
}

Assistant:

Deque(const Deque &other) :
            small_(other.small_.max_size()),
            current_(other.current_.max_size()),
            big_(other.big_.max_size()),
            allocator_() {
        copy(other);
    }